

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quass.cpp
# Opt level: O0

void __thiscall Quass::solve(Quass *this,QpVector *x0,QpVector *ra,Basis *b0,HighsTimer *timer)

{
  bool bVar1;
  RatiotestResult RVar2;
  bool bVar3;
  int iVar4;
  BasisStatus BVar5;
  HighsInt HVar6;
  QpVector *m;
  QpVector *p_00;
  QpVector *pQVar7;
  reference piVar8;
  vector<int,_std::allocator<int>_> *this_00;
  const_reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  undefined8 uVar12;
  int iVar13;
  Basis *in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *__buf_00;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  size_t *in_RDI;
  HighsTimer *in_R8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar15;
  RatiotestResult RVar16;
  SumNum SVar17;
  HighsInt i_1;
  HighsInt i;
  HighsInt var;
  HighsInt indexinbasis;
  int e;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  QpVector *lambda;
  HighsInt maxabsd;
  HighsInt constrainttodrop;
  RatiotestResult stepres;
  HighsInt unit;
  HighsInt minidx;
  double maxsteplength;
  bool zero_curvature_direction;
  QpSolverStatus status;
  bool log_report;
  double run_time;
  bool atfsep;
  HighsInt current_num_active;
  double logging_time_interval;
  double last_logging_time;
  HighsInt last_logging_iteration;
  QpVector buffer_d;
  QpVector buffer_Qp;
  QpVector buffer_m;
  QpVector buffer_l;
  QpVector buffer_gyp;
  QpVector buffer_yp;
  QpVector rowmove;
  QpVector p;
  unique_ptr<Pricing,_std::default_delete<Pricing>_> pricing;
  CholeskyFactor factor;
  ReducedGradient redgrad;
  ReducedCosts redcosts;
  Gradient gradient;
  Basis *basis;
  Runtime *in_stack_fffffffffffff838;
  Basis *in_stack_fffffffffffff840;
  Basis *in_stack_fffffffffffff848;
  undefined7 in_stack_fffffffffffff850;
  undefined1 in_stack_fffffffffffff857;
  undefined4 in_stack_fffffffffffff858;
  undefined4 in_stack_fffffffffffff85c;
  undefined4 in_stack_fffffffffffff860;
  HighsInt in_stack_fffffffffffff864;
  ReducedCosts *in_stack_fffffffffffff868;
  value_type vVar18;
  Basis *in_stack_fffffffffffff870;
  Basis *in_stack_fffffffffffff878;
  Basis *in_stack_fffffffffffff880;
  Runtime *in_stack_fffffffffffff888;
  undefined4 in_stack_fffffffffffff890;
  undefined4 in_stack_fffffffffffff894;
  ReducedGradient *in_stack_fffffffffffff898;
  CholeskyFactor *in_stack_fffffffffffff8a0;
  Basis *in_stack_fffffffffffff8a8;
  Runtime *in_stack_fffffffffffff8b0;
  undefined4 in_stack_fffffffffffff8b8;
  HighsInt in_stack_fffffffffffff8bc;
  Basis *in_stack_fffffffffffff8c0;
  long in_stack_fffffffffffff8c8;
  HighsInt in_stack_fffffffffffff8d0;
  int in_stack_fffffffffffff8d4;
  undefined4 in_stack_fffffffffffff8d8;
  QpSolverStatus in_stack_fffffffffffff8dc;
  Runtime *in_stack_fffffffffffff8e8;
  undefined4 in_stack_fffffffffffff8f0;
  QpSolverStatus in_stack_fffffffffffff8f4;
  undefined8 in_stack_fffffffffffff8f8;
  double in_stack_fffffffffffff900;
  CholeskyFactor *in_stack_fffffffffffff908;
  undefined4 in_stack_fffffffffffff910;
  HighsInt in_stack_fffffffffffff914;
  Runtime *in_stack_fffffffffffff918;
  HighsInt in_stack_fffffffffffff920;
  HighsInt in_stack_fffffffffffff924;
  undefined4 in_stack_fffffffffffff930;
  Instance *in_stack_fffffffffffff9a0;
  Basis *in_stack_fffffffffffff9a8;
  int local_634;
  int local_630;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_618;
  vector<int,_std::allocator<int>_> *local_610;
  QpVector *local_608;
  double local_600;
  HighsInt local_5f8;
  undefined4 local_5b4;
  RatiotestResult local_5b0;
  value_type local_5a0;
  int local_59c;
  Runtime *local_598;
  byte local_589;
  QpSolverStatus local_588;
  bool local_581;
  undefined4 local_574;
  byte local_56d;
  HighsInt local_56c;
  double local_568;
  double local_560;
  int local_554;
  undefined1 local_2e0 [60];
  HighsInt local_2a4;
  undefined1 local_1c8 [400];
  Basis *local_38;
  pointer local_30;
  HighsTimer *local_28;
  Basis *local_20;
  double dVar14;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_30 = (pointer)std::chrono::_V2::system_clock::now();
  *(pointer *)(*(long *)(*in_RDI + 0x8d8) + 8) = local_30;
  local_38 = local_20;
  QpVector::operator=((QpVector *)in_stack_fffffffffffff840,(QpVector *)in_stack_fffffffffffff838);
  Gradient::Gradient((Gradient *)in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  ReducedCosts::ReducedCosts
            ((ReducedCosts *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
             (Runtime *)in_stack_fffffffffffff848,in_stack_fffffffffffff840,
             (Gradient *)in_stack_fffffffffffff838);
  ReducedGradient::ReducedGradient
            ((ReducedGradient *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
             (Runtime *)in_stack_fffffffffffff848,in_stack_fffffffffffff840,
             (Gradient *)in_stack_fffffffffffff838);
  CholeskyFactor::CholeskyFactor
            ((CholeskyFactor *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
             in_stack_fffffffffffff888,in_stack_fffffffffffff880);
  Matrix::mat_vec((Matrix *)in_stack_fffffffffffff840,(QpVector *)in_stack_fffffffffffff838,
                  (QpVector *)0x75c395);
  getPricing((Runtime *)in_stack_fffffffffffff878,in_stack_fffffffffffff870,
             in_stack_fffffffffffff868);
  QpVector::QpVector((QpVector *)in_stack_fffffffffffff870,
                     (HighsInt)((ulong)in_stack_fffffffffffff868 >> 0x20));
  QpVector::QpVector((QpVector *)in_stack_fffffffffffff870,
                     (HighsInt)((ulong)in_stack_fffffffffffff868 >> 0x20));
  QpVector::QpVector((QpVector *)in_stack_fffffffffffff870,
                     (HighsInt)((ulong)in_stack_fffffffffffff868 >> 0x20));
  QpVector::QpVector((QpVector *)in_stack_fffffffffffff870,
                     (HighsInt)((ulong)in_stack_fffffffffffff868 >> 0x20));
  QpVector::QpVector((QpVector *)in_stack_fffffffffffff870,
                     (HighsInt)((ulong)in_stack_fffffffffffff868 >> 0x20));
  QpVector::QpVector((QpVector *)in_stack_fffffffffffff870,
                     (HighsInt)((ulong)in_stack_fffffffffffff868 >> 0x20));
  QpVector::QpVector((QpVector *)in_stack_fffffffffffff870,
                     (HighsInt)((ulong)in_stack_fffffffffffff868 >> 0x20));
  QpVector::QpVector((QpVector *)in_stack_fffffffffffff870,
                     (HighsInt)((ulong)in_stack_fffffffffffff868 >> 0x20));
  regularize((Runtime *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850));
  ratiotest_relax_instance(in_stack_fffffffffffff8e8);
  Instance::operator=((Instance *)in_stack_fffffffffffff840,&in_stack_fffffffffffff838->instance);
  Instance::~Instance((Instance *)in_stack_fffffffffffff840);
  local_554 = *(int *)(*(long *)(*in_RDI + 0x8d8) + 4) + -1;
  local_560 = 0.0;
  local_568 = 10.0;
  local_56c = Basis::getnumactive((Basis *)0x75c54c);
  RVar16.limitingconstraint = (int)in_stack_fffffffffffff8f8;
  RVar16.nowactiveatlower = (bool)(char)((ulong)in_stack_fffffffffffff8f8 >> 0x20);
  RVar16._13_3_ = (int3)((ulong)in_stack_fffffffffffff8f8 >> 0x28);
  RVar16.alpha = in_stack_fffffffffffff900;
  local_56d = local_56c == *(int *)(*in_RDI + 4);
  __buf = extraout_RDX;
  do {
    if (*(int *)(*in_RDI + 0x8c4) <= *(int *)(*(long *)(*in_RDI + 0x8d8) + 4)) {
      *(undefined4 *)(*in_RDI + 0x9c0) = 5;
LAB_0075d224:
      loginformation((Runtime *)in_stack_fffffffffffff8c0,
                     (Basis *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
                     (CholeskyFactor *)in_stack_fffffffffffff8b0,
                     (HighsTimer *)in_stack_fffffffffffff8a8);
      Eventhandler<Statistics_&>::fire
                ((Eventhandler<Statistics_&> *)
                 CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                 (Statistics *)in_stack_fffffffffffff888);
      Matrix::mat_vec((Matrix *)in_stack_fffffffffffff848,(QpVector *)in_stack_fffffffffffff840);
      SVar17 = Instance::sumnumprimalinfeasibilities
                         ((Instance *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                          (QpVector *)in_stack_fffffffffffff888,
                          (QpVector *)in_stack_fffffffffffff880);
      local_600 = SVar17.sum;
      local_5f8 = SVar17.num;
      QpVector::~QpVector((QpVector *)in_stack_fffffffffffff840);
      local_608 = ReducedCosts::getReducedCosts((ReducedCosts *)in_stack_fffffffffffff840);
      local_610 = Basis::getactive(local_38);
      local_618._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff838);
      std::vector<int,_std::allocator<int>_>::end
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff838);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                            *)in_stack_fffffffffffff840,
                           (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                            *)in_stack_fffffffffffff838);
        if (!bVar3) break;
        piVar8 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&local_618);
        iVar4 = *piVar8;
        this_00 = Basis::getindexinfactor(local_38);
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)iVar4);
        if (iVar4 < *(int *)(*in_RDI + 8)) {
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              (&local_608->value,(long)*pvVar9);
          vVar18 = *pvVar10;
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x9a8),
                               (long)iVar4);
          *pvVar10 = vVar18;
        }
        else {
          iVar13 = *(int *)(*in_RDI + 8);
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              (&local_608->value,(long)*pvVar9);
          vVar18 = *pvVar10;
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x970),
                               (long)(iVar4 - iVar13));
          *pvVar10 = vVar18;
        }
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&local_618);
      }
      QpVector::resparsify
                ((QpVector *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850));
      QpVector::resparsify
                ((QpVector *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850));
      for (local_630 = 0; local_630 < *(int *)(*in_RDI + 4); local_630 = local_630 + 1) {
        BVar5 = Basis::getstatus(in_stack_fffffffffffff840,
                                 (HighsInt)((ulong)in_stack_fffffffffffff838 >> 0x20));
        pvVar11 = std::vector<BasisStatus,_std::allocator<BasisStatus>_>::operator[]
                            ((vector<BasisStatus,_std::allocator<BasisStatus>_> *)(*in_RDI + 0x9c8),
                             (long)local_630);
        *pvVar11 = BVar5;
      }
      for (local_634 = 0; local_634 < *(int *)(*in_RDI + 8); local_634 = local_634 + 1) {
        BVar5 = Basis::getstatus(in_stack_fffffffffffff840,
                                 (HighsInt)((ulong)in_stack_fffffffffffff838 >> 0x20));
        pvVar11 = std::vector<BasisStatus,_std::allocator<BasisStatus>_>::operator[]
                            ((vector<BasisStatus,_std::allocator<BasisStatus>_> *)(*in_RDI + 0x9e0),
                             (long)local_634);
        *pvVar11 = BVar5;
      }
      HVar6 = Basis::getnumactive((Basis *)0x75d60f);
      if (HVar6 == *(int *)(*in_RDI + 4)) {
        Basis::recomputex(in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
        QpVector::operator=((QpVector *)in_stack_fffffffffffff840,
                            (QpVector *)in_stack_fffffffffffff838);
        QpVector::~QpVector((QpVector *)in_stack_fffffffffffff840);
      }
      uVar12 = std::chrono::_V2::system_clock::now();
      *(undefined8 *)(*(long *)(*in_RDI + 0x8d8) + 0x10) = uVar12;
      local_574 = 0;
      RVar2 = local_5b0;
LAB_0075d6da:
      local_5b0 = RVar2;
      QpVector::~QpVector((QpVector *)in_stack_fffffffffffff840);
      QpVector::~QpVector((QpVector *)in_stack_fffffffffffff840);
      QpVector::~QpVector((QpVector *)in_stack_fffffffffffff840);
      QpVector::~QpVector((QpVector *)in_stack_fffffffffffff840);
      QpVector::~QpVector((QpVector *)in_stack_fffffffffffff840);
      QpVector::~QpVector((QpVector *)in_stack_fffffffffffff840);
      QpVector::~QpVector((QpVector *)in_stack_fffffffffffff840);
      QpVector::~QpVector((QpVector *)in_stack_fffffffffffff840);
      std::unique_ptr<Pricing,_std::default_delete<Pricing>_>::~unique_ptr
                ((unique_ptr<Pricing,_std::default_delete<Pricing>_> *)in_stack_fffffffffffff840);
      CholeskyFactor::~CholeskyFactor((CholeskyFactor *)in_stack_fffffffffffff840);
      ReducedGradient::~ReducedGradient((ReducedGradient *)0x75d769);
      ReducedCosts::~ReducedCosts((ReducedCosts *)0x75d776);
      Gradient::~Gradient((Gradient *)0x75d783);
      return;
    }
    HighsTimer::read(local_28,0,__buf,*in_RDI);
    if (*(double *)(*in_RDI + 0x8c8) <= extraout_XMM0_Qa) {
      *(undefined4 *)(*in_RDI + 0x9c0) = 6;
      goto LAB_0075d224;
    }
    HVar6 = Basis::getnuminactive((Basis *)0x75c78e);
    if (*(int *)(*in_RDI + 0x8b0) < HVar6) {
      Eventhandler<int_&>::fire
                ((Eventhandler<int_&> *)
                 CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                 (int *)in_stack_fffffffffffff888);
      *(undefined4 *)(*in_RDI + 0x9c0) = 7;
      local_574 = 1;
      RVar2 = local_5b0;
      goto LAB_0075d6da;
    }
    HighsTimer::read(local_28,0,__buf_00,*in_RDI);
    if (((*(int *)(*(long *)(*in_RDI + 0x8d8) + 4) % *(int *)(*in_RDI + 0x860) == 0) ||
        (local_568 < extraout_XMM0_Qa_00 - local_560)) &&
       (local_554 < *(int *)(*(long *)(*in_RDI + 0x8d8) + 4))) {
      iVar4 = *(int *)(*(long *)(*in_RDI + 0x8d8) + 4);
      iVar13 = *(int *)(*in_RDI + 0x860) * 10;
      bVar3 = SBORROW4(iVar4,iVar13) == iVar4 + *(int *)(*in_RDI + 0x860) * -10 < 0;
      if (iVar4 != iVar13 && bVar3) {
        *(int *)(*in_RDI + 0x860) = *(int *)(*in_RDI + 0x860) * 10;
      }
      bVar1 = iVar4 == iVar13;
      bVar3 = !bVar3;
      local_581 = bVar1 || bVar3;
      if (local_568 * 10.0 < extraout_XMM0_Qa_00) {
        local_568 = local_568 * 2.0;
      }
      if (bVar1 || bVar3) {
        local_554 = *(int *)(*(long *)(*in_RDI + 0x8d8) + 4);
        local_560 = extraout_XMM0_Qa_00;
        loginformation((Runtime *)in_stack_fffffffffffff8c0,
                       (Basis *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
                       (CholeskyFactor *)in_stack_fffffffffffff8b0,
                       (HighsTimer *)in_stack_fffffffffffff8a8);
        Eventhandler<Statistics_&>::fire
                  ((Eventhandler<Statistics_&> *)
                   CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                   (Statistics *)in_stack_fffffffffffff888);
      }
    }
    bVar3 = check_reinvert_due((Basis *)0x75c99f);
    if (bVar3) {
      reinvert((Basis *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
               (CholeskyFactor *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
               (Gradient *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
               (ReducedCosts *)in_stack_fffffffffffff848,
               (ReducedGradient *)in_stack_fffffffffffff840,
               (unique_ptr<Pricing,_std::default_delete<Pricing>_> *)in_stack_fffffffffffff838);
    }
    local_589 = 0;
    local_598 = (Runtime *)0x3ff0000000000000;
    if ((local_56d & 1) == 0) {
      computesearchdirection_minor
                (in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,
                 in_stack_fffffffffffff898,
                 (QpVector *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
      computerowmove((Runtime *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
                     in_stack_fffffffffffff848,(QpVector *)in_stack_fffffffffffff840,
                     (QpVector *)in_stack_fffffffffffff838);
      tidyup((QpVector *)in_stack_fffffffffffff870,(QpVector *)in_stack_fffffffffffff868,
             (Basis *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
             (Runtime *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
      Matrix::mat_vec((Matrix *)in_stack_fffffffffffff840,(QpVector *)in_stack_fffffffffffff838,
                      (QpVector *)0x75ce07);
    }
    else {
      m = (QpVector *)
          std::unique_ptr<Pricing,_std::default_delete<Pricing>_>::operator->
                    ((unique_ptr<Pricing,_std::default_delete<Pricing>_> *)0x75ca22);
      p_00 = (QpVector *)(*in_RDI + 0x8e0);
      pQVar7 = Gradient::getGradient((Gradient *)in_stack_fffffffffffff840);
      iVar4 = (***(_func_int ***)m)(m,p_00,pQVar7);
      local_59c = iVar4;
      if (iVar4 == -1) {
        *(undefined4 *)(*in_RDI + 0x9c0) = 2;
        goto LAB_0075d224;
      }
      *(int *)(*(long *)(*in_RDI + 0x8d8) + 4) = *(int *)(*(long *)(*in_RDI + 0x8d8) + 4) + 1;
      pQVar7 = (QpVector *)Basis::getindexinfactor(local_38);
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)pQVar7,(long)local_59c);
      local_5a0 = *pvVar9;
      QpVector::unit((HighsInt)((ulong)in_stack_fffffffffffff840 >> 0x20),
                     (HighsInt)in_stack_fffffffffffff840,(QpVector *)in_stack_fffffffffffff838);
      Basis::btran((Basis *)CONCAT44(iVar4,in_stack_fffffffffffff930),pQVar7,
                   (QpVector *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                   SUB81((ulong)in_stack_fffffffffffff918 >> 0x38,0),
                   (HighsInt)in_stack_fffffffffffff918);
      in_stack_fffffffffffff924 = Basis::getnuminactive((Basis *)0x75cb62);
      local_2a4 = in_stack_fffffffffffff924;
      in_stack_fffffffffffff920 = Basis::getnuminactive((Basis *)0x75cb86);
      in_stack_fffffffffffff848 = (Basis *)local_1c8;
      in_stack_fffffffffffff840 = (Basis *)local_2e0;
      in_stack_fffffffffffff838 = (Runtime *)(local_2e0 + 0x38);
      local_2e0._4_4_ = in_stack_fffffffffffff920;
      computesearchdirection_major
                (in_stack_fffffffffffff918,
                 (Basis *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                 in_stack_fffffffffffff908,(QpVector *)RVar16.alpha,RVar16._8_8_,
                 (QpVector *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                 (QpVector *)CONCAT44(iVar4,in_stack_fffffffffffff930),m,p_00);
      Basis::deactivate(in_stack_fffffffffffff840,
                        (HighsInt)((ulong)in_stack_fffffffffffff838 >> 0x20));
      computerowmove((Runtime *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
                     in_stack_fffffffffffff848,(QpVector *)in_stack_fffffffffffff840,
                     (QpVector *)in_stack_fffffffffffff838);
      tidyup((QpVector *)in_stack_fffffffffffff870,(QpVector *)in_stack_fffffffffffff868,
             (Basis *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
             (Runtime *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
      local_598 = (Runtime *)std::numeric_limits<double>::infinity();
      in_stack_fffffffffffff918 =
           (Runtime *)
           computemaxsteplength
                     ((Runtime *)in_stack_fffffffffffff878,(QpVector *)in_stack_fffffffffffff870,
                      (Gradient *)in_stack_fffffffffffff868,
                      (QpVector *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                      (bool *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
      local_598 = in_stack_fffffffffffff918;
      if ((local_589 & 1) == 0) {
        local_588 = CholeskyFactor::expand
                              ((CholeskyFactor *)in_stack_fffffffffffff888,
                               (QpVector *)in_stack_fffffffffffff880,
                               (QpVector *)in_stack_fffffffffffff878,
                               (QpVector *)in_stack_fffffffffffff870,
                               (QpVector *)in_stack_fffffffffffff868);
        if (local_588 != OK) {
          *(undefined4 *)(*in_RDI + 0x9c0) = 1;
          local_574 = 1;
          RVar2 = local_5b0;
          goto LAB_0075d6da;
        }
        in_stack_fffffffffffff914 = 0;
      }
      ReducedGradient::expand
                ((ReducedGradient *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                 (QpVector *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
    }
    in_stack_fffffffffffff908 =
         (CholeskyFactor *)
         QpVector::norm2((QpVector *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    if (((double)in_stack_fffffffffffff908 < *(double *)(*in_RDI + 0x820)) ||
       (((double)local_598 == 0.0 && (!NAN((double)local_598))))) {
      local_56d = 1;
      __buf = extraout_RDX_00;
    }
    else {
      *(int *)(*(long *)(*in_RDI + 0x8d8) + 4) = *(int *)(*(long *)(*in_RDI + 0x8d8) + 4) + 1;
      RVar16 = ratiotest((Runtime *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
                         (QpVector *)in_stack_fffffffffffff848,(QpVector *)in_stack_fffffffffffff840
                         ,(double)in_stack_fffffffffffff838);
      dVar14 = RVar16.alpha;
      local_5b0.limitingconstraint = RVar16.limitingconstraint;
      if (local_5b0.limitingconstraint == -1) {
        local_5b0.alpha = dVar14;
        local_5b0._8_8_ = RVar16._8_8_;
        dVar15 = std::numeric_limits<double>::infinity();
        RVar2.limitingconstraint = local_5b0.limitingconstraint;
        RVar2.nowactiveatlower = local_5b0.nowactiveatlower;
        RVar2._13_3_ = local_5b0._13_3_;
        RVar2.alpha = local_5b0.alpha;
        if ((RVar16.alpha == dVar15) && (!NAN(RVar16.alpha) && !NAN(dVar15))) {
          *(undefined4 *)(*in_RDI + 0x9c0) = 3;
          local_574 = 1;
          goto LAB_0075d6da;
        }
        local_56d = 0;
        ReducedGradient::update
                  ((ReducedGradient *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                   (double)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                   (bool)in_stack_fffffffffffff857);
        uVar12 = RVar16._8_8_;
        in_stack_fffffffffffff8b0 = (Runtime *)RVar16.alpha;
        RVar16.limitingconstraint = (int)uVar12;
        RVar16.nowactiveatlower = (bool)(char)((ulong)uVar12 >> 0x20);
        RVar16._13_3_ = (int3)((ulong)uVar12 >> 0x28);
        RVar16.alpha = dVar14;
      }
      else {
        local_5b0 = RVar16;
        in_stack_fffffffffffff8f4 =
             reduce((Runtime *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                    (Basis *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                    (HighsInt)((ulong)in_stack_fffffffffffff8c8 >> 0x20),
                    (QpVector *)in_stack_fffffffffffff8c0,
                    (HighsInt *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
                    (HighsInt *)in_stack_fffffffffffff8b0);
        local_588 = in_stack_fffffffffffff8f4;
        if (in_stack_fffffffffffff8f4 != OK) {
          *(undefined4 *)(*in_RDI + 0x9c0) = 1;
          local_574 = 1;
          RVar2 = local_5b0;
          goto LAB_0075d6da;
        }
        if ((local_589 & 1) == 0) {
          Basis::getinactive(local_38);
          indexof<int>((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff868,
                       (int *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
          CholeskyFactor::reduce
                    ((CholeskyFactor *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920)
                     ,(QpVector *)in_stack_fffffffffffff918,in_stack_fffffffffffff914,
                     SUB41((uint)in_stack_fffffffffffff910 >> 0x18,0));
        }
        ReducedGradient::reduce
                  ((ReducedGradient *)in_stack_fffffffffffff870,
                   (QpVector *)in_stack_fffffffffffff868,in_stack_fffffffffffff864);
        ReducedGradient::update
                  ((ReducedGradient *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                   (double)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                   (bool)in_stack_fffffffffffff857);
        in_stack_fffffffffffff8c8 = *in_RDI + 0x800;
        in_stack_fffffffffffff8d4 = 2 - (local_5b0.nowactiveatlower & 1);
        in_stack_fffffffffffff8c0 = local_38;
        in_stack_fffffffffffff8d0 = local_5b0.limitingconstraint;
        in_stack_fffffffffffff8d8 = local_5b4;
        std::unique_ptr<Pricing,_std::default_delete<Pricing>_>::get
                  ((unique_ptr<Pricing,_std::default_delete<Pricing>_> *)in_stack_fffffffffffff840);
        in_stack_fffffffffffff8dc =
             Basis::activate(in_stack_fffffffffffff878,(Settings *)in_stack_fffffffffffff870,
                             (HighsInt)((ulong)in_stack_fffffffffffff868 >> 0x20),
                             (BasisStatus)in_stack_fffffffffffff868,in_stack_fffffffffffff864,
                             (Pricing *)
                             CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
        local_588 = in_stack_fffffffffffff8dc;
        if (in_stack_fffffffffffff8dc != OK) {
          *(undefined4 *)(*in_RDI + 0x9c0) = 1;
          local_574 = 1;
          RVar2 = local_5b0;
          goto LAB_0075d6da;
        }
        in_stack_fffffffffffff8bc = Basis::getnumactive((Basis *)0x75d102);
        if (in_stack_fffffffffffff8bc != *(int *)(*in_RDI + 4)) {
          local_56d = 0;
        }
      }
      QpVector::saxpy((QpVector *)in_stack_fffffffffffff880,(double)in_stack_fffffffffffff878,
                      (QpVector *)in_stack_fffffffffffff870);
      QpVector::saxpy((QpVector *)in_stack_fffffffffffff880,(double)in_stack_fffffffffffff878,
                      (QpVector *)in_stack_fffffffffffff870);
      Gradient::update((Gradient *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
                       (QpVector *)in_stack_fffffffffffff848,(double)in_stack_fffffffffffff840);
      ReducedCosts::update((ReducedCosts *)(local_1c8 + 0xf8));
      __buf = extraout_RDX_01;
    }
  } while( true );
}

Assistant:

void Quass::solve(const QpVector& x0, const QpVector& ra, Basis& b0,
                  HighsTimer& timer) {
  // feenableexcept(FE_ALL_EXCEPT & ~FE_INEXACT & ~FE_UNDERFLOW);

  runtime.statistics.time_start = std::chrono::high_resolution_clock::now();
  Basis& basis = b0;
  runtime.primal = x0;

  // TODO: remove redundant equations before starting
  // HOWTO: from crash start, check all (near-)equality constraints (not
  // bounds). if the residual is 0 (or near-zero?), remove constraint

  Gradient gradient(runtime);
  ReducedCosts redcosts(runtime, basis, gradient);
  ReducedGradient redgrad(runtime, basis, gradient);
  CholeskyFactor factor(runtime, basis);
  runtime.instance.A.mat_vec(runtime.primal, runtime.rowactivity);
  std::unique_ptr<Pricing> pricing = getPricing(runtime, basis, redcosts);

  QpVector p(runtime.instance.num_var);
  QpVector rowmove(runtime.instance.num_con);

  QpVector buffer_yp(runtime.instance.num_var);
  QpVector buffer_gyp(runtime.instance.num_var);
  QpVector buffer_l(runtime.instance.num_var);
  QpVector buffer_m(runtime.instance.num_var);

  QpVector buffer_Qp(runtime.instance.num_var);

  // buffers for reduction
  QpVector buffer_d(runtime.instance.num_var);

  regularize(runtime);

  runtime.relaxed_for_ratiotest = ratiotest_relax_instance(runtime);

  HighsInt last_logging_iteration = runtime.statistics.num_iterations - 1;
  double last_logging_time = 0;
  double logging_time_interval = 10;

  const HighsInt current_num_active = basis.getnumactive();
  bool atfsep = current_num_active == runtime.instance.num_var;
  while (true) {
    // check iteration limit
    if (runtime.statistics.num_iterations >= runtime.settings.iteration_limit) {
      runtime.status = QpModelStatus::kIterationLimit;
      break;
    }

    // check time limit
    if (timer.read() >= runtime.settings.time_limit) {
      runtime.status = QpModelStatus::kTimeLimit;
      break;
    }

    if (basis.getnuminactive() > runtime.settings.nullspace_limit) {
      runtime.settings.nullspace_limit_log.fire(
          runtime.settings.nullspace_limit);
      runtime.status = QpModelStatus::kLargeNullspace;
      return;
    }

    // LOGGING
    double run_time = timer.read();
    if ((runtime.statistics.num_iterations %
                 runtime.settings.reportingfequency ==
             0 ||
         run_time - last_logging_time > logging_time_interval) &&
        runtime.statistics.num_iterations > last_logging_iteration) {
      bool log_report = true;
      if (runtime.statistics.num_iterations >
          10 * runtime.settings.reportingfequency) {
        runtime.settings.reportingfequency *= 10;
        log_report = false;
      }
      if (run_time > 10 * logging_time_interval) logging_time_interval *= 2.0;
      if (log_report) {
        last_logging_time = run_time;
        last_logging_iteration = runtime.statistics.num_iterations;
        loginformation(runtime, basis, factor, timer);
        runtime.settings.iteration_log.fire(runtime.statistics);
      }
    }

    // REINVERSION
    if (check_reinvert_due(basis)) {
      reinvert(basis, factor, gradient, redcosts, redgrad, pricing);
    }

    QpSolverStatus status;

    bool zero_curvature_direction = false;
    double maxsteplength = 1.0;
    if (atfsep) {
      // Determine a variable to relax from being active. If there is
      // none, then basis is optimal
      HighsInt minidx = pricing->price(runtime.primal, gradient.getGradient());
      if (minidx == -1) {
        runtime.status = QpModelStatus::kOptimal;
        break;
      }
      // Now perform a real iteration
      runtime.statistics.num_iterations++;

      HighsInt unit = basis.getindexinfactor()[minidx];
      QpVector::unit(runtime.instance.num_var, unit, buffer_yp);
      basis.btran(buffer_yp, buffer_yp, true, minidx);

      buffer_l.dim = basis.getnuminactive();
      buffer_m.dim = basis.getnuminactive();
      computesearchdirection_major(runtime, basis, factor, buffer_yp, gradient,
                                   buffer_gyp, buffer_l, buffer_m, p);
      basis.deactivate(minidx);
      computerowmove(runtime, basis, p, rowmove);
      tidyup(p, rowmove, basis, runtime);
      maxsteplength = std::numeric_limits<double>::infinity();
      // if (runtime.instance.Q.mat.value.size() > 0) {
      maxsteplength = computemaxsteplength(runtime, p, gradient, buffer_Qp,
                                           zero_curvature_direction);
      if (!zero_curvature_direction) {
        status = factor.expand(buffer_yp, buffer_gyp, buffer_l, buffer_m);
        if (status != QpSolverStatus::OK) {
          runtime.status = QpModelStatus::kUndetermined;
          return;
        }
      }
      redgrad.expand(buffer_yp);
    } else {
      // Compute a search direction - which may be zero, in which case
      // atfsep is set true and the loop repeats with this
      // condition. In particular, this happens when the current basis
      // is optimal
      computesearchdirection_minor(runtime, basis, factor, redgrad, p);
      computerowmove(runtime, basis, p, rowmove);
      tidyup(p, rowmove, basis, runtime);
      runtime.instance.Q.mat_vec(p, buffer_Qp);
    }
    if (p.norm2() < runtime.settings.pnorm_zero_threshold ||
        maxsteplength == 0.0 ||
        (false && fabs(gradient.getGradient().dot(p)) <
                      runtime.settings.improvement_zero_threshold)) {
      atfsep = true;
    } else {
      // Now perform a real iteration
      runtime.statistics.num_iterations++;

      RatiotestResult stepres = ratiotest(runtime, p, rowmove, maxsteplength);
      if (stepres.limitingconstraint != -1) {
        HighsInt constrainttodrop;
        HighsInt maxabsd;
        status = reduce(runtime, basis, stepres.limitingconstraint, buffer_d,
                        maxabsd, constrainttodrop);
        if (status != QpSolverStatus::OK) {
          runtime.status = QpModelStatus::kUndetermined;
          return;
        }
        if (!zero_curvature_direction) {
          factor.reduce(
              buffer_d, maxabsd,
              indexof(basis.getinactive(), stepres.limitingconstraint) != -1);
        }
        redgrad.reduce(buffer_d, maxabsd);
        redgrad.update(stepres.alpha, false);

        status = basis.activate(runtime.settings, stepres.limitingconstraint,
                                stepres.nowactiveatlower
                                    ? BasisStatus::kActiveAtLower
                                    : BasisStatus::kActiveAtUpper,
                                constrainttodrop, pricing.get());
        if (status != QpSolverStatus::OK) {
          runtime.status = QpModelStatus::kUndetermined;
          return;
        }
        if (basis.getnumactive() != runtime.instance.num_var) {
          atfsep = false;
        }
      } else {
        if (stepres.alpha == std::numeric_limits<double>::infinity()) {
          // unbounded
          runtime.status = QpModelStatus::kUnbounded;
          return;
        }
        atfsep = false;
        redgrad.update(stepres.alpha, false);
      }

      runtime.primal.saxpy(stepres.alpha, p);
      runtime.rowactivity.saxpy(stepres.alpha, rowmove);

      gradient.update(buffer_Qp, stepres.alpha);
      redcosts.update();
    }
  }

  loginformation(runtime, basis, factor, timer);
  runtime.settings.iteration_log.fire(runtime.statistics);
  //  basis.report();

  runtime.instance.sumnumprimalinfeasibilities(
      runtime.primal, runtime.instance.A.mat_vec(runtime.primal));

  QpVector& lambda = redcosts.getReducedCosts();
  for (auto e : basis.getactive()) {
    HighsInt indexinbasis = basis.getindexinfactor()[e];
    if (e >= runtime.instance.num_con) {
      // active variable bound
      HighsInt var = e - runtime.instance.num_con;
      runtime.dualvar.value[var] = lambda.value[indexinbasis];
    } else {
      runtime.dualcon.value[e] = lambda.value[indexinbasis];
    }
  }
  runtime.dualcon.resparsify();
  runtime.dualvar.resparsify();

  // QpVector actual_dual_var(runtime.instance.num_var);
  // QpVector actual_dual_con(runtime.instance.num_con);
  // compute_actual_duals(runtime, basis, redcosts.getReducedCosts(),
  // actual_dual_con, actual_dual_var); printf("max primal violation =
  // %.20lf\n", compute_primal_violation(runtime)); printf("max dual   violation
  // = %.20lf\n", compute_dual_violation(runtime.instance, runtime.primal,
  // actual_dual_con, actual_dual_var));

  // extract basis status
  for (HighsInt i = 0; i < runtime.instance.num_var; i++) {
    runtime.status_var[i] = basis.getstatus(runtime.instance.num_con + i);
  }

  for (HighsInt i = 0; i < runtime.instance.num_con; i++) {
    runtime.status_con[i] = basis.getstatus(i);
  }

  if (basis.getnumactive() == runtime.instance.num_var) {
    runtime.primal = basis.recomputex(runtime.instance);
  }
  // x.report("x");
  runtime.statistics.time_end = std::chrono::high_resolution_clock::now();
}